

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O0

bool __thiscall cmCTestVC::Update(cmCTestVC *this)

{
  cmCTest *this_00;
  bool bVar1;
  uint uVar2;
  byte local_8d;
  byte local_8c;
  byte local_8b;
  allocator<char> local_59;
  string local_58;
  string local_38;
  byte local_11;
  cmCTestVC *pcStack_10;
  bool result;
  cmCTestVC *this_local;
  
  local_11 = 1;
  this_00 = this->CTest;
  pcStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"UpdateVersionOnly",&local_59);
  cmCTest::GetCTestConfiguration(&local_38,this_00,&local_58);
  bVar1 = cmSystemTools::IsOn(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    uVar2 = (*this->_vptr_cmCTestVC[3])();
    local_8b = 0;
    if ((uVar2 & 1) != 0) {
      local_8b = local_11;
    }
    local_11 = local_8b & 1;
    std::operator<<(this->Log,"--- Begin Update ---\n");
    uVar2 = (*this->_vptr_cmCTestVC[4])();
    local_8c = 0;
    if ((uVar2 & 1) != 0) {
      local_8c = local_11;
    }
    local_11 = local_8c & 1;
    std::operator<<(this->Log,"--- End Update ---\n");
  }
  uVar2 = (*this->_vptr_cmCTestVC[5])();
  local_8d = 0;
  if ((uVar2 & 1) != 0) {
    local_8d = local_11;
  }
  return (bool)(local_8d & 1);
}

Assistant:

bool cmCTestVC::Update()
{
  bool result = true;
  // if update version only is on then do not actually update,
  // just note the current version and finish
  if (!cmSystemTools::IsOn(
        this->CTest->GetCTestConfiguration("UpdateVersionOnly"))) {
    result = this->NoteOldRevision() && result;
    this->Log << "--- Begin Update ---\n";
    result = this->UpdateImpl() && result;
    this->Log << "--- End Update ---\n";
  }
  result = this->NoteNewRevision() && result;
  return result;
}